

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

void __thiscall Liby::EventLoopGroup::run(EventLoopGroup *this,BoolFunctor *bf)

{
  vector<std::thread,_std::allocator<std::thread>_> *__alloc;
  pointer *pptVar1;
  allocator_type *__a;
  thread *__first;
  int iVar2;
  pointer __result;
  thread *ptVar3;
  int *in_RCX;
  pointer __args_1;
  ulong uVar4;
  undefined1 local_7c [12];
  pointer local_70;
  int *local_68;
  ulong local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_58._M_unused._M_object = (EventLoopGroup *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:26:29)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:26:29)>
             ::_M_manager;
  Signal::signal(0xd,(__sighandler_t)local_58._M_pod_data);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::function<bool_()>::operator=(&this->bf_,bf);
  __alloc = &this->threads_;
  for (uVar4 = 1; iVar2 = (int)uVar4, iVar2 + -1 < this->n_; uVar4 = (ulong)((int)uVar4 + 1)) {
    __a = (allocator_type *)
          (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish;
    local_7c._0_4_ = iVar2;
    local_58._M_unused._M_object = this;
    if (__a == (allocator_type *)
               (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_60 = uVar4;
      local_68 = (int *)std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                  (__alloc,1,"vector::_M_realloc_insert");
      __first = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start;
      __args_1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      local_70 = __args_1;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&__alloc->super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            (size_t)local_68);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,Liby::EventLoopGroup::run(std::function<bool()>)::__1,int>
                ((allocator_type *)(((long)__a - (long)__first) + (long)__result),
                 (thread *)&local_58,(anon_class_8_1_8991fb9c_for__M_head_impl *)local_7c,
                 (int *)__args_1);
      local_7c._4_8_ = __result;
      ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (__first,(thread *)__a,__result,(allocator<std::thread> *)__alloc);
      ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         ((thread *)__a,local_70,ptVar3 + 1,(allocator<std::thread> *)__alloc);
      if (__first != (thread *)0x0) {
        operator_delete(__first);
      }
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_7c._4_8_;
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar3;
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(local_7c._4_8_ + local_68 * 8);
      in_RCX = local_68;
      uVar4 = local_60;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,Liby::EventLoopGroup::run(std::function<bool()>)::__1,int>
                (__a,(thread *)&local_58,(anon_class_8_1_8991fb9c_for__M_head_impl *)local_7c,in_RCX
                );
      pptVar1 = &(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
  }
  worker_thread(this,0);
  return;
}

Assistant:

void EventLoopGroup::run(BoolFunctor bf) {
    Signal::signal(SIGPIPE, [] { error("receive SIGPIPE"); });

    bf_ = bf;
    for (int i = 0; i < n_; i++) {
        threads_.emplace_back([this](int index) { worker_thread(index); },
                              i + 1);
    }

    worker_thread(0);
}